

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffbinse(char *binspec,int *imagetype,int *histaxis,char (*colname) [71],double *minin,
           double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
           char (*binname) [71],double *wt,char *wtname,int *recip,char ***exprs,int *status)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char **ppcVar8;
  undefined1 *puVar9;
  char **local_140;
  char *ptr_1;
  size_t nchars;
  int has_exprs;
  char *exprend [5];
  char *local_f8;
  char *exprbeg [5];
  double local_c8;
  double dummy;
  char *file_expr;
  char tmpname [71];
  int *local_68;
  char *ptr;
  int local_58;
  int defaulttype;
  int slen;
  int ii;
  double *maxin_local;
  double *minin_local;
  char (*colname_local) [71];
  int *histaxis_local;
  int *imagetype_local;
  char *binspec_local;
  
  dummy = 0.0;
  _slen = maxin;
  maxin_local = minin;
  minin_local = (double *)colname;
  colname_local = (char (*) [71])histaxis;
  histaxis_local = imagetype;
  imagetype_local = (int *)binspec;
  memset(&local_f8,0,0x28);
  memset(&stack0xfffffffffffffed8,0,0x28);
  bVar5 = false;
  if (exprs != (char ***)0x0) {
    *exprs = (char **)0x0;
  }
  if (*status < 1) {
    *(char *)((long)colname_local + 0) = '\x02';
    *(char *)((long)colname_local + 1) = '\0';
    *(char *)((long)colname_local + 2) = '\0';
    *(char *)((long)colname_local + 3) = '\0';
    *histaxis_local = 0x1f;
    ptr._4_4_ = 1;
    *wt = 1.0;
    *recip = 0;
    *wtname = '\0';
    for (defaulttype = 0; defaulttype < 4; defaulttype = defaulttype + 1) {
      *(undefined1 *)((long)minin_local + (long)defaulttype * 0x47) = 0;
      minname[defaulttype][0] = '\0';
      maxname[defaulttype][0] = '\0';
      binname[defaulttype][0] = '\0';
      maxin_local[defaulttype] = -9.1191291391491e-36;
      _slen[defaulttype] = -9.1191291391491e-36;
      binsizein[defaulttype] = -9.1191291391491e-36;
    }
    local_68 = (int *)((long)imagetype_local + 3);
    if (*(char *)local_68 == 'i') {
      *histaxis_local = 0x15;
      ptr._4_4_ = 0;
      local_68 = imagetype_local + 1;
    }
    else if (*(char *)local_68 == 'j') {
      ptr._4_4_ = 0;
      local_68 = imagetype_local + 1;
    }
    else if (*(char *)local_68 == 'r') {
      *histaxis_local = 0x2a;
      ptr._4_4_ = 0;
      local_68 = imagetype_local + 1;
    }
    else if (*(char *)local_68 == 'd') {
      *histaxis_local = 0x52;
      ptr._4_4_ = 0;
      local_68 = imagetype_local + 1;
    }
    else {
      cVar1 = *(char *)local_68;
      if (cVar1 == 'b') {
        *histaxis_local = 0xb;
        ptr._4_4_ = 0;
        local_68 = imagetype_local + 1;
      }
      ptr._4_4_ = (uint)(cVar1 != 'b');
    }
    if ((char)*local_68 == '\0') {
      binspec_local._4_4_ = *status;
    }
    else if ((char)*local_68 == ' ') {
      for (; (char)*local_68 == ' '; local_68 = (int *)((long)local_68 + 1)) {
      }
      if ((char)*local_68 == '\0') {
        binspec_local._4_4_ = *status;
      }
      else {
        if ((char)*local_68 == '@') {
          iVar6 = ffimport_file((char *)((long)local_68 + 1),(char **)&dummy,status);
          if (iVar6 != 0) {
            return *status;
          }
          for (local_68 = (int *)dummy; (char)*local_68 == ' ';
              local_68 = (int *)((long)local_68 + 1)) {
          }
        }
        if ((char)*local_68 == '(') {
          for (defaulttype = 0; defaulttype < 4; defaulttype = defaulttype + 1) {
            do {
              local_68 = (int *)((long)local_68 + 1);
            } while (*(char *)local_68 == ' ');
            sVar7 = strcspn((char *)local_68," ,)");
            local_58 = (int)sVar7;
            strncat((char *)((long)minin_local + (long)defaulttype * 0x47),(char *)local_68,
                    (long)local_58);
            for (local_68 = (int *)((long)local_68 + (long)local_58); (char)*local_68 == ' ';
                local_68 = (int *)((long)local_68 + 1)) {
            }
            if ((char)*local_68 == ')') {
              *(int *)*colname_local = defaulttype + 1;
              break;
            }
          }
          if (defaulttype == 4) {
            ffpmsg("binning specification has too many column names or is missing closing \')\':");
            ffpmsg((char *)imagetype_local);
            if (dummy != 0.0) {
              free((void *)dummy);
            }
            *status = 0x7d;
            return 0x7d;
          }
          do {
            piVar4 = local_68;
            local_68 = (int *)((long)piVar4 + 1);
          } while (*(char *)local_68 == ' ');
          if (*(char *)local_68 == '\0') {
            if (dummy != 0.0) {
              free((void *)dummy);
            }
            return *status;
          }
          if (*(char *)local_68 != '=') {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg(" an equals sign \'=\' must follow the column names");
            ffpmsg((char *)imagetype_local);
            if (dummy != 0.0) {
              free((void *)dummy);
            }
            *status = 0x7d;
            return 0x7d;
          }
          for (local_68 = (int *)((long)piVar4 + 2); (char)*local_68 == ' ';
              local_68 = (int *)((long)local_68 + 1)) {
          }
          ffbinr((char **)&local_68,(char *)&file_expr,maxin_local,_slen,binsizein,*minname,*maxname
                 ,*binname,status);
          if (0 < *status) {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg((char *)imagetype_local);
            if (dummy != 0.0) {
              free((void *)dummy);
            }
            return *status;
          }
          for (defaulttype = 1; defaulttype < *(int *)*colname_local; defaulttype = defaulttype + 1)
          {
            maxin_local[defaulttype] = *maxin_local;
            _slen[defaulttype] = *_slen;
            binsizein[defaulttype] = *binsizein;
            strcpy(minname[defaulttype],*minname);
            strcpy(maxname[defaulttype],*maxname);
            strcpy(binname[defaulttype],*binname);
          }
          for (; (char)*local_68 == ' '; local_68 = (int *)((long)local_68 + 1)) {
          }
          if ((char)*local_68 != ';') {
            if ((char)*local_68 != '\0') {
              ffpmsg("illegal syntax after binning range specification in URL:");
              ffpmsg((char *)imagetype_local);
              if (dummy != 0.0) {
                free((void *)dummy);
              }
              *status = 0x7d;
              return 0x7d;
            }
            return *status;
          }
        }
        else {
          for (defaulttype = 0; defaulttype < 4; defaulttype = defaulttype + 1) {
            exprend[(long)defaulttype + -1] = (char *)0x0;
            exprbeg[(long)defaulttype + -1] = (char *)0x0;
            ffbinre((char **)&local_68,(char *)((long)minin_local + (long)defaulttype * 0x47),
                    exprbeg + (long)defaulttype + -1,exprend + (long)defaulttype + -1,
                    maxin_local + defaulttype,_slen + defaulttype,binsizein + defaulttype,
                    minname[defaulttype],maxname[defaulttype],binname[defaulttype],status);
            if (exprbeg[(long)defaulttype + -1] != (char *)0x0) {
              bVar5 = true;
            }
            if (0 < *status) {
              ffpmsg("illegal syntax in binning range specification in URL:");
              ffpmsg((char *)imagetype_local);
              if (dummy != 0.0) {
                free((void *)dummy);
              }
              return *status;
            }
            if (((char)*local_68 == '\0') || ((char)*local_68 == ';')) break;
            if ((char)*local_68 == ' ') {
              for (; (char)*local_68 == ' '; local_68 = (int *)((long)local_68 + 1)) {
              }
              if (((char)*local_68 == '\0') || ((char)*local_68 == ';')) break;
              if ((char)*local_68 == ',') {
                local_68 = (int *)((long)local_68 + 1);
              }
            }
            else {
              if ((char)*local_68 != ',') {
                ffpmsg("illegal characters following binning specification in URL:");
                ffpmsg((char *)imagetype_local);
                if (dummy != 0.0) {
                  free((void *)dummy);
                }
                *status = 0x7d;
                return 0x7d;
              }
              local_68 = (int *)((long)local_68 + 1);
            }
          }
          if (defaulttype == 4) {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg("apparently greater than 4 histogram dimensions");
            ffpmsg((char *)imagetype_local);
            *status = 0x7d;
            return 0x7d;
          }
          *(int *)*colname_local = defaulttype + 1;
          if (((((*(int *)*colname_local == 1) && (*(char *)minin_local == '\0')) &&
               (*maxin_local == -9.1191291391491e-36)) &&
              ((!NAN(*maxin_local) && (*_slen == -9.1191291391491e-36)))) && (!NAN(*_slen))) {
            *(char *)((long)colname_local + 0) = '\x02';
            *(char *)((long)colname_local + 1) = '\0';
            *(char *)((long)colname_local + 2) = '\0';
            *(char *)((long)colname_local + 3) = '\0';
            binsizein[1] = *binsizein;
          }
        }
        if ((char)*local_68 == ';') {
          do {
            piVar4 = local_68;
            local_68 = (int *)((long)piVar4 + 1);
          } while (*(char *)local_68 == ' ');
          *recip = 0;
          if (*(char *)local_68 == '/') {
            *recip = 1;
            for (local_68 = (int *)((long)piVar4 + 2); (char)*local_68 == ' ';
                local_68 = (int *)((long)local_68 + 1)) {
            }
          }
          exprend[3] = (char *)0x0;
          exprbeg[3] = (char *)0x0;
          ffbinre((char **)&local_68,wtname,exprbeg + 3,exprend + 3,&local_c8,&local_c8,wt,
                  (char *)&file_expr,(char *)&file_expr,(char *)&file_expr,status);
          if (exprbeg[3] != (char *)0x0) {
            bVar5 = true;
          }
          if (0 < *status) {
            ffpmsg("illegal binning weight specification in URL:");
            ffpmsg((char *)imagetype_local);
            if (dummy != 0.0) {
              free((void *)dummy);
            }
            return *status;
          }
          if ((((ptr._4_4_ != 0) && ((*wt != 1.0 || (NAN(*wt))))) ||
              ((ptr._4_4_ != 0 && (*wtname != '\0')))) ||
             ((ptr._4_4_ != 0 && (exprbeg[3] != (char *)0x0)))) {
            *histaxis_local = 0x2a;
          }
        }
        for (; (char)*local_68 == ' '; local_68 = (int *)((long)local_68 + 1)) {
        }
        if ((char)*local_68 != '\0') {
          ffpmsg("illegal syntax after binning weight specification in URL:");
          ffpmsg((char *)imagetype_local);
          *status = 0x7d;
        }
        if (dummy != 0.0) {
          free((void *)dummy);
        }
        if (bVar5) {
          ptr_1 = (char *)0x0;
          for (defaulttype = 0; defaulttype < 5; defaulttype = defaulttype + 1) {
            ptr_1 = ptr_1 + (long)(exprend[(long)defaulttype + -1] +
                                  (1 - (long)exprbeg[(long)defaulttype + -1]));
          }
          ppcVar8 = (char **)malloc((size_t)(ptr_1 + 0x28));
          if (ppcVar8 == (char **)0x0) {
            ffpmsg("ffbinse: memory allocation failure");
            *status = 0x71;
            return 0x71;
          }
          *exprs = ppcVar8;
          local_140 = *exprs + 5;
          for (defaulttype = 0; defaulttype < 5; defaulttype = defaulttype + 1) {
            (*exprs)[defaulttype] = (char *)local_140;
            pcVar2 = exprend[(long)defaulttype + -1];
            pcVar3 = exprbeg[(long)defaulttype + -1];
            strncpy((char *)local_140,exprbeg[(long)defaulttype + -1],(long)pcVar2 - (long)pcVar3);
            puVar9 = (undefined1 *)(((long)pcVar2 - (long)pcVar3) + (long)local_140);
            *puVar9 = 0;
            local_140 = (char **)(puVar9 + 1);
          }
        }
        binspec_local._4_4_ = *status;
      }
    }
    else {
      ffpmsg("binning specification syntax error:");
      ffpmsg((char *)imagetype_local);
      *status = 0x7d;
      binspec_local._4_4_ = 0x7d;
    }
  }
  else {
    binspec_local._4_4_ = *status;
  }
  return binspec_local._4_4_;
}

Assistant:

int ffbinse(char *binspec,   /* I - binning specification */
                   int *imagetype,      /* O - image type, TINT or TSHORT */
                   int *histaxis,       /* O - no. of axes in the histogram */
                   char colname[4][FLEN_VALUE],  /* column name for axis */
                   double *minin,        /* minimum value for each axis */
                   double *maxin,        /* maximum value for each axis */
                   double *binsizein,    /* size of bins on each axis */
                   char minname[4][FLEN_VALUE],  /* keyword name for min */
                   char maxname[4][FLEN_VALUE],  /* keyword name for max */
                   char binname[4][FLEN_VALUE],  /* keyword name for binsize */
                   double *wt,          /* weighting factor          */
                   char *wtname,        /* keyword or column name for weight */
                   int *recip,          /* the reciprocal of the weight? */
	           char ***exprs,       /* returned with expressions (or 0) */
                   int *status)
{
/*
   Parse the extended input binning specification string, returning
   the binning parameters.  Supports up to 4 dimensions.  The binspec
   string has one of these forms:

   bin binsize                  - 2D histogram with binsize on each axis
   bin xcol                     - 1D histogram on column xcol
   bin (xcol, ycol) = binsize   - 2D histogram with binsize on each axis
   bin x=min:max:size, y=min:max:size, z..., t... 
   bin x=:max, y=::size
   bin x=size, y=min::size
   bin x(expr), y(expr)=min:max:size, ...

   most other reasonable combinations are supported. The (expr) is an 
   optional expression that will be calculated on the fly instead of
   a table column name.  The name is still used for the output pixel
   array metadata.

   If expr == 0, then expressions are forbidden.  The caller does not
   expect expressions.  

   If exprs is non-zero, then upon return an array of expressions is
   passed back to the caller.  Storage may be allocated by this routine,
   If *exprs is non-zero upon return, the caller is responsible to
   free(*exprs).  Upon return, the contains of exprs is,
       (*exprs)[0] = expression for column 1 (or 0 if none)
       (*exprs)[1] = expression for column 2 (or 0 if none)
       (*exprs)[2] = expression for column 3 (or 0 if none)
       (*exprs)[3] = expression for column 4 (or 0 if none)
       (*exprs)[4] = expression for weighting (or 0 if none)

   If the user specifies a column name and not an expression for bin
   axis i, then the corresponding (*exprs)[i] will be a null pointer.

   To be recognized as an expression, the weighting expression must be
   enclosed in parentheses.

   Expressions are never allowed using the bin (xcol,ycol) notation.

*/
    int ii, slen, defaulttype;
    char *ptr, tmpname[FLEN_VALUE], *file_expr = NULL;
    double  dummy;
    char *exprbeg[5] = {0}, *exprend[5] = {0};
    int has_exprs = 0;

    if (exprs) (*exprs) = 0; /* initialized output */

    if (*status > 0)
         return(*status);

    /* set the default values */
    *histaxis = 2;
    *imagetype = TINT;
    defaulttype = 1;
    *wt = 1.;
    *recip = 0;
    *wtname = '\0';

    /* set default values */
    for (ii = 0; ii < 4; ii++)
    {
        *colname[ii] = '\0';
        *minname[ii] = '\0';
        *maxname[ii] = '\0';
        *binname[ii] = '\0';
        minin[ii] = DOUBLENULLVALUE;  /* undefined values */
        maxin[ii] = DOUBLENULLVALUE;
        binsizein[ii] = DOUBLENULLVALUE;
    }

    ptr = binspec + 3;  /* skip over 'bin' */

    if (*ptr == 'i' )  /* bini */
    {
        *imagetype = TSHORT;
        defaulttype = 0;
        ptr++;
    }
    else if (*ptr == 'j' )  /* binj; same as default */
    {
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'r' )  /* binr */
    {
        *imagetype = TFLOAT;
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'd' )  /* bind */
    {
        *imagetype = TDOUBLE;
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'b' )  /* binb */
    {
        *imagetype = TBYTE;
        defaulttype = 0;
        ptr ++;
    }

    if (*ptr == '\0')  /* use all defaults for other parameters */
        return(*status);
    else if (*ptr != ' ')  /* must be at least one blank */
    {
        ffpmsg("binning specification syntax error:");
        ffpmsg(binspec);
        return(*status = URL_PARSE_ERROR);
    }

    while (*ptr == ' ')  /* skip over blanks */
           ptr++;

    if (*ptr == '\0')   /* no other parameters; use defaults */
        return(*status);

    /* Check if need to import expression from a file */

    if( *ptr=='@' ) {
       if( ffimport_file( ptr+1, &file_expr, status ) ) return(*status);
       ptr = file_expr;
       while (*ptr == ' ')
               ptr++;       /* skip leading white space... again */
    }

    if (*ptr == '(' )
    {
        /* this must be the opening parenthesis around a list of column */
        /* names, optionally followed by a '=' and the binning spec. */

        for (ii = 0; ii < 4; ii++)
        {
            ptr++;               /* skip over the '(', ',', or ' ') */
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            slen = strcspn(ptr, " ,)");
            strncat(colname[ii], ptr, slen); /* copy 1st column name */

            ptr += slen;
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            if (*ptr == ')' )   /* end of the list of names */
            {
                *histaxis = ii + 1;
                break;
            }
        }

        if (ii == 4)   /* too many names in the list , or missing ')'  */
        {
            ffpmsg(
 "binning specification has too many column names or is missing closing ')':");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        ptr++;  /* skip over the closing parenthesis */
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        if (*ptr == '\0') {
	    if( file_expr ) free( file_expr );
            return(*status);  /* parsed the entire string */
	}

        else if (*ptr != '=')  /* must be an equals sign now*/
        {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg(" an equals sign '=' must follow the column names");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        ptr++;  /* skip over the equals sign */
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        /* get the single range specification for all the columns */
	/* Note that the extended syntax is not allowed here */
        ffbinr(&ptr, tmpname, minin,
	       maxin, binsizein, minname[0],
	       maxname[0], binname[0], status);
        if (*status > 0)
        {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        for (ii = 1; ii < *histaxis; ii++)
        {
            minin[ii] = minin[0];
            maxin[ii] = maxin[0];
            binsizein[ii] = binsizein[0];
            strcpy(minname[ii], minname[0]);
            strcpy(maxname[ii], maxname[0]);
            strcpy(binname[ii], binname[0]);
        }

        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        if (*ptr == ';')
            goto getweight;   /* a weighting factor is specified */

        if (*ptr != '\0')  /* must have reached end of string */
        {
            ffpmsg("illegal syntax after binning range specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        return(*status);
    }             /* end of case with list of column names in ( )  */

    /* if we've reached this point, then the binning specification */
    /* must be of the form: XCOL = min:max:binsize, YCOL = ...     */
    /* where the column name followed by '=' are optional.         */
    /* If the column name is not specified, then use the default name */

    for (ii = 0; ii < 4; ii++) /* allow up to 4 histogram dimensions */
    {
        exprbeg[ii] = exprend[ii] = 0;
        ffbinre(&ptr, colname[ii], &(exprbeg[ii]), &(exprend[ii]),
		&minin[ii], &maxin[ii], &binsizein[ii], minname[ii],
		maxname[ii], binname[ii], status);
	/* Check for expressions */
	if (exprbeg[ii]) has_exprs = 1;
	
        if (*status > 0)
        {
            ffpmsg("illegal syntax in binning range specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        if (*ptr == '\0' || *ptr == ';')
            break;        /* reached the end of the string */

        if (*ptr == ' ')
        {
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            if (*ptr == '\0' || *ptr == ';')
                break;        /* reached the end of the string */

            if (*ptr == ',')
                ptr++;  /* comma separates the next column specification */
        }
        else if (*ptr == ',')
        {          
            ptr++;  /* comma separates the next column specification */
        }
        else
        {
            ffpmsg("illegal characters following binning specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }
    }

    if (ii == 4)
    {
        /* there are yet more characters in the string */
        ffpmsg("illegal binning specification in URL:");
        ffpmsg("apparently greater than 4 histogram dimensions");
        ffpmsg(binspec);
        return(*status = URL_PARSE_ERROR);
    }
    else
        *histaxis = ii + 1;

    /* special case: if a single number was entered it should be      */
    /* interpreted as the binning factor for the default X and Y axes */

    if (*histaxis == 1 && *colname[0] == '\0' && 
         minin[0] == DOUBLENULLVALUE && maxin[0] == DOUBLENULLVALUE)
    {
        *histaxis = 2;
        binsizein[1] = binsizein[0];
    }

getweight:
    if (*ptr == ';')  /* looks like a weighting factor is given */
    {
        ptr++;
       
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        *recip = 0;
        if (*ptr == '/')
        {
            *recip = 1;  /* the reciprocal of the weight is entered */
            ptr++;

            while (*ptr == ' ')  /* skip over blanks */
                ptr++;
        }

        /* parse the weight as though it were a binrange. */
        /* either a column name or a numerical value will be returned */

        exprbeg[4] = exprend[4] = 0;
        ffbinre(&ptr, wtname, &(exprbeg[4]), &(exprend[4]),
		&dummy, &dummy, wt, tmpname,
		tmpname, tmpname, status);
	if (exprbeg[4]) has_exprs = 1;

        if (*status > 0)
        {
            ffpmsg("illegal binning weight specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        /* creat a float datatype histogram by default, if weight */
        /* factor is not = 1.0  */

        if ( (defaulttype && *wt != 1.0) || 
	     (defaulttype && *wtname) ||
	     (defaulttype && exprbeg[4])) {
	  *imagetype = TFLOAT;
	}
    }

    while (*ptr == ' ')  /* skip over blanks */
         ptr++;

    if (*ptr != '\0')  /* should have reached the end of string */
    {
        ffpmsg("illegal syntax after binning weight specification in URL:");
        ffpmsg(binspec);
        *status = URL_PARSE_ERROR;
    }

    if( file_expr ) free( file_expr );

    /* If we found expressions, this is where we accumulate them into 
       something to be returned to the caller.  The start and end of
       each expression will be found in exprbeg[] and exprend[], with
       the 5th entry being the weight expression if any */
    if (has_exprs) {
      size_t nchars = 0;
      char *ptr;
      for (ii = 0; ii <= 4; ii++) {
	nchars += (exprend[ii] - exprbeg[ii]) + 1; /* null terminator */
      }
      /* Allocate storage for 5 pointers plus the characters.  Caller
         is responsible to free(*exprs) which will free both the 5-array
	 and the character string data. */
      ptr = malloc( sizeof(char *) * 5 + nchars * sizeof(char) );
      if (!ptr) {
	ffpmsg("ffbinse: memory allocation failure");
        return(*status = MEMORY_ALLOCATION);
      }
      
      (*exprs) = (char **) ptr;     /* Pointer array portion */
      ptr = (char *) (&((*exprs)[5])); /* String portion starts after the pointer array */
      for (ii = 0; ii <= 4; ii++) {
	(*exprs)[ii] = ptr;
	nchars = (exprend[ii]-exprbeg[ii]);
	strncpy(ptr, exprbeg[ii], nchars);
	ptr += nchars;
	ptr[0] = 0; /* Ensure null terminator */
	ptr ++; /* Advance to next string position */
      }
    }      
      
    return(*status);
}